

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StateSpaceFilter.cpp
# Opt level: O2

double __thiscall
rtb::Filter::StateSpaceFilter<double>::filter
          (StateSpaceFilter<double> *this,double value,double time,double f0)

{
  double dVar1;
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  
  if (this->lastTime_ <= time) {
    dVar6 = time - this->lastTime_;
    dVar7 = f0 * 6.283185307179586 * f0 * 6.283185307179586;
    dVar10 = dVar6 + dVar6;
    dVar14 = dVar6 * dVar6;
    dVar5 = f0 * 8.885765876316732 * dVar10 + 4.0;
    auVar13._0_8_ = dVar5 - dVar14 * dVar7;
    auVar13._8_8_ = dVar6 * -4.0 * dVar7;
    dVar5 = dVar14 * dVar7 + dVar5;
    dVar4 = this->lastValue_;
    dVar1 = this->lastFirstDerivative_;
    dVar3 = value + dVar4;
    auVar8._0_8_ = dVar7 * dVar10 * dVar6;
    auVar8._8_8_ = dVar7 * dVar6 * 4.0;
    auVar11._8_8_ = -dVar14 * dVar7 + f0 * 8.885765876316732 * -dVar10 + 4.0;
    auVar11._0_8_ = dVar6 * 4.0;
    auVar9._8_8_ = dVar5;
    auVar9._0_8_ = dVar5;
    auVar13 = divpd(auVar13,auVar9);
    auVar12._8_8_ = dVar5;
    auVar12._0_8_ = dVar5;
    auVar12 = divpd(auVar11,auVar12);
    auVar2._8_8_ = dVar5;
    auVar2._0_8_ = dVar5;
    auVar9 = divpd(auVar8,auVar2);
    value = dVar3 * auVar9._0_8_ * 0.5 + dVar4 * auVar13._0_8_ + dVar1 * auVar12._0_8_;
    dVar4 = dVar3 * auVar9._8_8_ * 0.5 + dVar4 * auVar13._8_8_ + dVar1 * auVar12._8_8_;
    dVar6 = (dVar4 - dVar1) / dVar6;
    this->lastValue_ = value;
    this->lastFirstDerivative_ = dVar4;
  }
  else {
    this->lastValue_ = value;
    this->lastFirstDerivative_ = 0.0;
    dVar6 = 0.0;
  }
  this->lastSecondDerivative_ = dVar6;
  this->lastTime_ = time;
  return value;
}

Assistant:

T StateSpaceFilter<T>::filter(T value, double time, double f0) {

            if (time < lastTime_)
            {
                lastValue_ = value;
                lastFirstDerivative_ = 0.0;
                lastSecondDerivative_ = 0.0;
            }
            else
            {
                double h = time - lastTime_;
                double a = (2 * M_PI * f0) * (2 * M_PI * f0);
                double b = sqrt(2) * 2 * M_PI * f0;
                double denom = 4 + 2 * h * b + h * h * a;
                double A = (4 + 2 * h*b - h * h * a) / denom;
                double B = 4 * h / denom;
                double C = -4 * h*a / denom;
                double D = (4 - 2 * h * b - h * h * a) / denom;
                double E = 2 * h * h * a / denom;
                double F = 4 * h*a / denom;
                double y = A*lastValue_ + B*lastFirstDerivative_ + E*(value + lastValue_) / 2;
                double yd = C*lastValue_ + D*lastFirstDerivative_ + F*(value + lastValue_) / 2;
                lastSecondDerivative_ = (yd - lastFirstDerivative_) / h;

                lastValue_ = y;
                lastFirstDerivative_ = yd;
            }
            lastTime_ = time;
            return lastValue_;
        }